

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_pgrsStartNow(Curl_easy *data)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  curltime cVar4;
  undefined4 uStack_14;
  Curl_easy *data_local;
  
  (data->progress).speeder_c = 0;
  cVar4 = Curl_now();
  (data->progress).start.tv_sec = cVar4.tv_sec;
  *(ulong *)&(data->progress).start.tv_usec = CONCAT44(uStack_14,cVar4.tv_usec);
  (data->progress).field_0x194 = (data->progress).field_0x194 & 0xfd;
  (data->progress).ul.limit.start.tv_sec = (data->progress).start.tv_sec;
  uVar3 = *(undefined4 *)&(data->progress).start.field_0xc;
  (data->progress).ul.limit.start.tv_usec = (data->progress).start.tv_usec;
  *(undefined4 *)&(data->progress).ul.limit.start.field_0xc = uVar3;
  (data->progress).dl.limit.start.tv_sec = (data->progress).start.tv_sec;
  uVar3 = *(undefined4 *)&(data->progress).start.field_0xc;
  (data->progress).dl.limit.start.tv_usec = (data->progress).start.tv_usec;
  *(undefined4 *)&(data->progress).dl.limit.start.field_0xc = uVar3;
  (data->progress).ul.limit.start_size = 0;
  (data->progress).dl.limit.start_size = 0;
  (data->progress).dl.cur_size = 0;
  (data->progress).ul.cur_size = 0;
  (data->progress).flags = (data->progress).flags & 0x90;
  uVar1 = (data->progress).start.tv_sec;
  uVar2 = (data->progress).start.tv_usec;
  cVar4.tv_usec = uVar2;
  cVar4.tv_sec = uVar1;
  cVar4._12_4_ = 0;
  Curl_ratelimit(data,cVar4);
  return;
}

Assistant:

void Curl_pgrsStartNow(struct Curl_easy *data)
{
  data->progress.speeder_c = 0; /* reset the progress meter display */
  data->progress.start = Curl_now();
  data->progress.is_t_startransfer_set = false;
  data->progress.ul.limit.start = data->progress.start;
  data->progress.dl.limit.start = data->progress.start;
  data->progress.ul.limit.start_size = 0;
  data->progress.dl.limit.start_size = 0;
  data->progress.dl.cur_size = 0;
  data->progress.ul.cur_size = 0;
  /* clear all bits except HIDE and HEADERS_OUT */
  data->progress.flags &= PGRS_HIDE|PGRS_HEADERS_OUT;
  Curl_ratelimit(data, data->progress.start);
}